

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::
int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::hex_writer::operator()
          (hex_writer *this,ostream_iterator<char,_char,_std::char_traits<char>_> *it)

{
  int iVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  long lVar6;
  char *__value;
  char buffer [10];
  ostream_iterator<char,_char,_std::char_traits<char>_> local_40;
  char acStack_2b [11];
  
  local_40._M_stream = it->_M_stream;
  local_40._M_string = it->_M_string;
  pcVar3 = "0123456789ABCDEF";
  if (*(char *)(*(long *)(*(long *)this + 8) + 0x11) == 'x') {
    pcVar3 = "0123456789abcdef";
  }
  iVar1 = *(int *)(this + 8);
  lVar6 = (long)iVar1;
  __value = acStack_2b;
  pcVar4 = acStack_2b + lVar6;
  uVar5 = *(uint *)(*(long *)this + 0x10);
  do {
    *pcVar4 = pcVar3[uVar5 & 0xf];
    pcVar4 = pcVar4 + -1;
    bVar2 = 0xf < uVar5;
    uVar5 = uVar5 >> 4;
  } while (bVar2);
  if (0 < iVar1) {
    do {
      __value = __value + 1;
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_40,__value);
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  it->_M_stream = local_40._M_stream;
  it->_M_string = local_40._M_string;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_uint<4, char_type>(
              it, self.abs_value, num_digits, self.spec.type != 'x');
      }